

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O0

void __thiscall
testing::anon_unknown_18::BetweenCardinalityImpl::DescribeTo
          (BetweenCardinalityImpl *this,ostream *os)

{
  ostream *poVar1;
  ostream *in_RSI;
  long in_RDI;
  int in_stack_0000010c;
  string local_80 [32];
  string local_60 [48];
  string local_30 [48];
  
  if (*(int *)(in_RDI + 8) == 0) {
    if (*(int *)(in_RDI + 0xc) == 0) {
      std::operator<<(in_RSI,"never called");
    }
    else if (*(int *)(in_RDI + 0xc) == 0x7fffffff) {
      std::operator<<(in_RSI,"called any number of times");
    }
    else {
      poVar1 = std::operator<<(in_RSI,"called at most ");
      (anonymous_namespace)::FormatTimes_abi_cxx11_(in_stack_0000010c);
      std::operator<<(poVar1,local_30);
      std::__cxx11::string::~string(local_30);
    }
  }
  else if (*(int *)(in_RDI + 8) == *(int *)(in_RDI + 0xc)) {
    poVar1 = std::operator<<(in_RSI,"called ");
    (anonymous_namespace)::FormatTimes_abi_cxx11_(in_stack_0000010c);
    std::operator<<(poVar1,local_60);
    std::__cxx11::string::~string(local_60);
  }
  else if (*(int *)(in_RDI + 0xc) == 0x7fffffff) {
    poVar1 = std::operator<<(in_RSI,"called at least ");
    (anonymous_namespace)::FormatTimes_abi_cxx11_(in_stack_0000010c);
    std::operator<<(poVar1,local_80);
    std::__cxx11::string::~string(local_80);
  }
  else {
    poVar1 = std::operator<<(in_RSI,"called between ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(int *)(in_RDI + 8));
    poVar1 = std::operator<<(poVar1," and ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(int *)(in_RDI + 0xc));
    std::operator<<(poVar1," times");
  }
  return;
}

Assistant:

void BetweenCardinalityImpl::DescribeTo(::std::ostream* os) const {
  if (min_ == 0) {
    if (max_ == 0) {
      *os << "never called";
    } else if (max_ == INT_MAX) {
      *os << "called any number of times";
    } else {
      *os << "called at most " << FormatTimes(max_);
    }
  } else if (min_ == max_) {
    *os << "called " << FormatTimes(min_);
  } else if (max_ == INT_MAX) {
    *os << "called at least " << FormatTimes(min_);
  } else {
    // 0 < min_ < max_ < INT_MAX
    *os << "called between " << min_ << " and " << max_ << " times";
  }
}